

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O1

REF_STATUS ref_histogram_gnuplot(REF_HISTOGRAM ref_histogram,char *description)

{
  int iVar1;
  int iVar2;
  FILE *__s;
  ulong uVar3;
  REF_STATUS RVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  char filename [1024];
  double local_450;
  char local_438 [1032];
  
  if ((long)ref_histogram->nbin < 1) {
    iVar1 = 0;
  }
  else {
    lVar5 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + ref_histogram->bins[lVar5];
      lVar5 = lVar5 + 1;
    } while (ref_histogram->nbin != lVar5);
  }
  if (iVar1 < 1) {
    local_450 = 0.0;
  }
  else {
    local_450 = 1.0 / (double)iVar1;
  }
  snprintf(local_438,0x400,"ref_histogram_%s.gnuplot",description);
  __s = fopen(local_438,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",local_438);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0xdb,"ref_histogram_gnuplot","unable to open file");
    RVar4 = 2;
  }
  else {
    fwrite("set terminal postscript eps enhanced color\n",0x2b,1,__s);
    RVar4 = 0;
    snprintf(local_438,0x400,"ref_histogram_%s.eps",description);
    fprintf(__s,"set output \'%s\'\n",local_438);
    fwrite("set style data histogram\n",0x19,1,__s);
    fwrite("set style histogram cluster gap 1\n",0x22,1,__s);
    fwrite("set style fill solid border -1\n",0x1f,1,__s);
    fwrite("set boxwidth 0.9\n",0x11,1,__s);
    fwrite("set xtic rotate by -45 scale 0\n",0x1f,1,__s);
    fwrite("set yrange [0:0.4]\n",0x13,1,__s);
    fprintf(__s,"set format y \"%%.2f\"\n");
    fprintf(__s,"plot \'-\' using 2:xticlabels(1) title \'%s\' linecolor rgb \"#FF0000\"\n",
            description);
    uVar3 = (ulong)(uint)ref_histogram->nbin;
    if (1 < ref_histogram->nbin) {
      lVar5 = 0;
      do {
        iVar1 = ref_histogram->bins[lVar5];
        iVar2 = (int)lVar5;
        dVar6 = exp2((double)(iVar2 - ((int)(((uint)(uVar3 >> 0x1f) & 1) + (int)uVar3) >> 1)) *
                     (1.0 / ref_histogram->exp));
        lVar5 = lVar5 + 1;
        dVar7 = exp2((double)((iVar2 - ref_histogram->nbin / 2) + 1) * (1.0 / ref_histogram->exp));
        fprintf(__s,"%.2f-%.2f %.5f\n",dVar6,dVar7,(double)iVar1 * local_450);
        uVar3 = (ulong)ref_histogram->nbin;
      } while (lVar5 < (long)(uVar3 - 1));
    }
    fclose(__s);
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_gnuplot(REF_HISTOGRAM ref_histogram,
                                         const char *description) {
  REF_INT i;
  FILE *f;
  char filename[1024];
  REF_INT sum;
  REF_DBL norm, portion;

  sum = 0;
  for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
    sum += ref_histogram_bin(ref_histogram, i);
  norm = 0.0;
  if (0 < sum) norm = 1.0 / (REF_DBL)sum;

  snprintf(filename, 1024, "ref_histogram_%s.gnuplot", description);
  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "set terminal postscript eps enhanced color\n");
  snprintf(filename, 1024, "ref_histogram_%s.eps", description);
  fprintf(f, "set output '%s'\n", filename);

  fprintf(f, "set style data histogram\n");
  fprintf(f, "set style histogram cluster gap 1\n");
  fprintf(f, "set style fill solid border -1\n");
  fprintf(f, "set boxwidth 0.9\n");
  fprintf(f, "set xtic rotate by -45 scale 0\n");
  fprintf(f, "set yrange [0:0.4]\n");
  fprintf(f, "set format y \"%%.2f\"\n");
  fprintf(
      f,
      "plot '-' using 2:xticlabels(1) title '%s' linecolor rgb \"#FF0000\"\n",
      description);

  for (i = 0; i < ref_histogram_nbin(ref_histogram) - 1; i++) {
    portion = (REF_DBL)ref_histogram_bin(ref_histogram, i) * norm;
    fprintf(f, "%.2f-%.2f %.5f\n", ref_histogram_to_obs(i),
            ref_histogram_to_obs(i + 1), portion);
  }

  fclose(f);

  return REF_SUCCESS;
}